

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O2

char * trial::protocol::json::detail::scan_digit<char>(char *marker,char *tail)

{
  uint uVar1;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  
  lVar3 = (long)tail - (long)marker;
  while( true ) {
    if (lVar3 < 0x11) {
      while ((pbVar2 = (byte *)tail, marker != tail &&
             (pbVar2 = (byte *)marker, (traits::flags<char>(char)::data[(byte)*marker] & 2) != 0)))
      {
        marker = (char *)((byte *)marker + 1);
      }
      return (char *)pbVar2;
    }
    auVar5[0] = -('t' < (char)(*marker + 0x46U));
    auVar5[1] = -('t' < (char)(((byte *)marker)[1] + 0x46));
    auVar5[2] = -('t' < (char)(((byte *)marker)[2] + 0x46));
    auVar5[3] = -('t' < (char)(((byte *)marker)[3] + 0x46));
    auVar5[4] = -('t' < (char)(((byte *)marker)[4] + 0x46));
    auVar5[5] = -('t' < (char)(((byte *)marker)[5] + 0x46));
    auVar5[6] = -('t' < (char)(((byte *)marker)[6] + 0x46));
    auVar5[7] = -('t' < (char)(((byte *)marker)[7] + 0x46));
    auVar5[8] = -('t' < (char)(((byte *)marker)[8] + 0x46));
    auVar5[9] = -('t' < (char)(((byte *)marker)[9] + 0x46));
    auVar5[10] = -('t' < (char)(((byte *)marker)[10] + 0x46));
    auVar5[0xb] = -('t' < (char)(((byte *)marker)[0xb] + 0x46));
    auVar5[0xc] = -('t' < (char)(((byte *)marker)[0xc] + 0x46));
    auVar5[0xd] = -('t' < (char)(((byte *)marker)[0xd] + 0x46));
    auVar5[0xe] = -('t' < (char)(((byte *)marker)[0xe] + 0x46));
    auVar5[0xf] = -('t' < (char)(((byte *)marker)[0xf] + 0x46));
    uVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar5[0xf] >> 7) << 0xf) ^ 0xffff;
    if (uVar4 != 0) break;
    marker = (char *)((byte *)marker + 0x10);
    lVar3 = lVar3 + -0x10;
  }
  uVar1 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  return (char *)((byte *)marker + uVar1);
}

Assistant:

auto scan_digit(const CharT *marker,
                const CharT * const tail) noexcept -> const CharT *
{
#if defined(TRIAL_PROTOCOL_USE_SSE2)
    // Shift digits to range [0x75, 0x7F] to make single range comparison
    const auto offset = _mm_set1_epi8(0x7F - 0x39);
    const auto legal = _mm_set1_epi8(0x7F - 10);
    while (tail - marker > 16)
    {
        auto data = _mm_loadu_si128((const __m128i *)marker);
        data = _mm_add_epi8(data, offset);
        data = _mm_cmplt_epi8(data, legal);
        const auto mask = _mm_movemask_epi8(data);
        if (mask != 0)
            return marker + core::detail::countr_zero(mask);
        marker += 16;
    }
#endif

    while (marker != tail)
    {
        if (traits::is_digit(*marker))
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}